

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O0

void __thiscall Gnuplot::Gnuplot(Gnuplot *this,string *style)

{
  string *ctx;
  string *style_local;
  Gnuplot *this_local;
  
  this->gnucmd = (FILE *)0x0;
  this->valid = false;
  this->two_dim = false;
  this->nplots = 0;
  ctx = style;
  std::__cxx11::string::string((string *)&this->pstyle);
  std::__cxx11::string::string((string *)&this->smooth);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->tmpfile_list);
  init(this,(EVP_PKEY_CTX *)ctx);
  set_style(this,style);
  return;
}

Assistant:

inline Gnuplot::Gnuplot(const std::string &style)
    : gnucmd(NULL),
      valid(false),
      two_dim(false),
      nplots(0) {
  init();
  set_style(style);
}